

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

void __thiscall
afsm::test::TranFSM_StaticHandledEvents_Test::TestBody(TranFSM_StaticHandledEvents_Test *this)

{
  bool bVar1;
  event_set *peVar2;
  Message *pMVar3;
  char *pcVar4;
  size_type sVar5;
  char *in_R9;
  string local_5a0;
  AssertHelper local_580;
  Message local_578;
  key_type local_570;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_530;
  Message local_528;
  key_type local_520;
  bool local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_4e0;
  Message local_4d8;
  key_type local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_490;
  Message local_488;
  key_type local_480;
  size_type local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_440;
  Message local_438;
  key_type local_430;
  size_type local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3f0;
  Message local_3e8;
  key_type local_3e0;
  size_type local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3a0;
  Message local_398;
  key_type local_390;
  size_type local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_350;
  Message local_348;
  key_type local_340;
  size_type local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_300;
  Message local_2f8;
  key_type local_2f0 [3];
  size_type local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_;
  connection_fsm fsm;
  TranFSM_StaticHandledEvents_Test *this_local;
  
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   *)&gtest_ar_.message_);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_2f0[0] = (key_type)&detail::event<afsm::test::events::connect>::id;
  local_2d8 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,local_2f0);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_2d0,&local_2d8,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pMVar3 = testing::Message::operator<<(&local_2f8,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2d0,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::connect>::id )","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x185,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_340 = (key_type)&detail::event<afsm::test::events::terminate>::id;
  local_338 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,&local_340);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_330,&local_338,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pMVar3 = testing::Message::operator<<(&local_348,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_330,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::terminate>::id )","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x188,pcVar4);
    testing::internal::AssertHelper::operator=(&local_350,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_390 = (key_type)&detail::event<afsm::test::events::complete>::id;
  local_388 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,&local_390);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_380,&local_388,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pMVar3 = testing::Message::operator<<(&local_398,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_380,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::complete>::id )","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3a0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_3e0 = (key_type)&detail::event<afsm::test::events::conn_error>::id;
  local_3d8 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,&local_3e0);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_3d0,&local_3d8,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pMVar3 = testing::Message::operator<<(&local_3e8,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_3d0,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::conn_error>::id )","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x18e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3f0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_430 = (key_type)&detail::event<afsm::test::events::ready_for_query>::id;
  local_428 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,&local_430);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_420,&local_428,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pMVar3 = testing::Message::operator<<(&local_438,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_420,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id )",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x191,pcVar4);
    testing::internal::AssertHelper::operator=(&local_440,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_480 = (key_type)&detail::event<afsm::test::events::begin>::id;
  local_478 = std::
              set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
              ::count(peVar2,&local_480);
  testing::AssertionResult::AssertionResult<unsigned_long>
            ((AssertionResult *)local_470,&local_478,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pMVar3 = testing::Message::operator<<(&local_488,(char (*) [26])"Immediately handled event");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_470,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::begin>::id )","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x194,pcVar4);
    testing::internal::AssertHelper::operator=(&local_490,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_4d0 = (key_type)&detail::event<afsm::test::events::commit>::id;
  sVar5 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar2,&local_4d0);
  local_4c1 = sVar5 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pMVar3 = testing::Message::operator<<
                       (&local_4d8,(char (*) [32])"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_4c0,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::commit>::id )","true",
               "false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x199,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_520 = (key_type)&detail::event<afsm::test::events::row_event>::id;
  sVar5 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar2,&local_520);
  local_511 = sVar5 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_510,&local_511,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pMVar3 = testing::Message::operator<<
                       (&local_528,(char (*) [32])"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_510,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::row_event>::id )","true",
               "false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_530,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  peVar2 = detail::state_base_impl<afsm::test::connection_fsm_def,_false>::static_handled_events();
  local_570 = (key_type)&detail::event<afsm::test::events::command_complete>::id;
  sVar5 = std::
          set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
          ::count(peVar2,&local_570);
  local_561 = sVar5 == 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_560,&local_561,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pMVar3 = testing::Message::operator<<
                       (&local_578,(char (*) [32])"Event handled by a nested state");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5a0,(internal *)local_560,
               (AssertionResult *)
               "fsm.static_handled_events().count( &detail::event<events::command_complete>::id )",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x19f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_580,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                    *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(TranFSM, StaticHandledEvents)
{
    connection_fsm fsm;

    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::connect>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::terminate>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::complete>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::conn_error>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::begin>::id ))
            << "Immediately handled event";


    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::commit>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::row_event>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::command_complete>::id ))
            << "Event handled by a nested state";
}